

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type __thiscall
duckdb::Deserializer::
Read<duckdb::unique_ptr<duckdb::ListAggregatesBindData,std::default_delete<duckdb::ListAggregatesBindData>,true>,duckdb::ListAggregatesBindData>
          (Deserializer *this)

{
  int iVar1;
  _func_int **in_RAX;
  Deserializer *in_RSI;
  FunctionData local_18;
  
  this->_vptr_Deserializer = (_func_int **)0x0;
  local_18._vptr_FunctionData = in_RAX;
  iVar1 = (*in_RSI->_vptr_Deserializer[10])();
  if ((char)iVar1 != '\0') {
    (*in_RSI->_vptr_Deserializer[6])();
    ListAggregatesBindData::Deserialize((ListAggregatesBindData *)&stack0xffffffffffffffe8,in_RSI);
    this->_vptr_Deserializer = local_18._vptr_FunctionData;
    (*in_RSI->_vptr_Deserializer[7])();
  }
  (*in_RSI->_vptr_Deserializer[0xb])();
  return (unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>_>
          )(unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>_>
            )this;
}

Assistant:

inline typename std::enable_if<is_unique_ptr<T>::value && has_deserialize<ELEMENT_TYPE>::value, T>::type Read() {
		unique_ptr<ELEMENT_TYPE> ptr = nullptr;
		auto is_present = OnNullableBegin();
		if (is_present) {
			OnObjectBegin();
			ptr = ELEMENT_TYPE::Deserialize(*this);
			OnObjectEnd();
		}
		OnNullableEnd();
		return ptr;
	}